

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void duckdb_fmt::v6::internal::
     handle_char_specs<char,duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,duckdb_fmt::v6::internal::error_handler>::char_spec_handler>
               (basic_format_specs<char> *specs,char_spec_handler *handler)

{
  long in_RDI;
  char_spec_handler *in_stack_ffffffffffffffb0;
  allocator *paVar1;
  string *in_stack_ffffffffffffffc8;
  error_handler *in_stack_ffffffffffffffd0;
  
  if (in_RDI == 0) {
    arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    ::char_spec_handler::on_char((char_spec_handler *)0x3579e0);
  }
  else if ((*(char *)(in_RDI + 8) == '\0') || (*(char *)(in_RDI + 8) == 'c')) {
    if (((*(byte *)(in_RDI + 9) & 0xf) == 4) ||
       (((*(byte *)(in_RDI + 9) >> 4 & 7) != 0 || (*(char *)(in_RDI + 9) < '\0')))) {
      paVar1 = (allocator *)&stack0xffffffffffffffcf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffd0,"invalid format specifier for char",paVar1);
      error_handler::on_error(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    ::char_spec_handler::on_char((char_spec_handler *)0x357ac1);
  }
  else {
    arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    ::char_spec_handler::on_int(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_char_specs(const basic_format_specs<Char>* specs,
                                     Handler&& handler) {
  if (!specs) return handler.on_char();
  if (specs->type && specs->type != 'c') return handler.on_int();
  if (specs->align == align::numeric || specs->sign != sign::none || specs->alt)
    handler.on_error("invalid format specifier for char");
  handler.on_char();
}